

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O0

void Gia_ManSatokoReport(int iOutput,int status,abctime clk)

{
  abctime clk_local;
  int status_local;
  int iOutput_local;
  
  if (iOutput < 0) {
    Abc_Print(1,"Total: ");
  }
  else {
    Abc_Print(1,"Output %6d : ",(ulong)(uint)iOutput);
  }
  if (status == 0) {
    Abc_Print(1,"UNDECIDED      ");
  }
  else if (status == 1) {
    Abc_Print(1,"SATISFIABLE    ");
  }
  else {
    Abc_Print(1,"UNSATISFIABLE  ");
  }
  Abc_PrintTime(1,"Time",clk);
  return;
}

Assistant:

void Gia_ManSatokoReport( int iOutput, int status, abctime clk )
{
    if ( iOutput >= 0 )
        Abc_Print( 1, "Output %6d : ", iOutput );
    else
        Abc_Print( 1, "Total: " );

    if ( status == SATOKO_UNDEC )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( status == SATOKO_SAT )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );

    Abc_PrintTime( 1, "Time", clk );
}